

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::setCapacity
          (Vector<kj::Own<capnp::_::SegmentBuilder>_> *this,size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_> newBuilder;
  ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_> local_30;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 4)) {
    ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_30.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::Own<capnp::_::SegmentBuilder>>
                           (newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>>::
  addAll<kj::ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>>>
            ((ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>> *)&local_30,&this->builder);
  ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::operator=(&this->builder,&local_30);
  ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }